

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abeta.hpp
# Opt level: O3

double minimax::ABeta_<ttt::Board,minimax::Eval<ttt::Board>>
                 (Board *game,int depth,double alfa,double beta)

{
  pointer plVar1;
  IPlayer IVar2;
  int iVar3;
  bool bVar4;
  pointer plVar5;
  double dVar6;
  ulong in_XMM0_Qb;
  ulong extraout_XMM0_Qb;
  double dVar7;
  ulong in_XMM1_Qb;
  Eval<ttt::Board> evaluator;
  Board new_game;
  long m;
  vector<long,_std::allocator<long>_> moves;
  Eval<ttt::Board> local_a1;
  double local_a0;
  Board local_98;
  double local_88;
  ulong uStack_80;
  long local_70;
  double local_68;
  ulong uStack_60;
  double local_58;
  ulong uStack_50;
  vector<long,_std::allocator<long>_> local_48;
  
  local_88 = alfa;
  local_68 = beta;
  if (depth == 0) {
    local_a0 = Eval<ttt::Board>::operator()(&local_a1,game);
  }
  else {
    uStack_80 = in_XMM0_Qb;
    uStack_60 = in_XMM1_Qb;
    iVar3 = ttt::Board::GetStatus(game);
    if (iVar3 == -1) {
      ttt::Board::GetPossibleMoves(&local_48,game);
      if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        dVar7 = 0.0;
      }
      else {
        local_58 = -local_68;
        uStack_50 = uStack_60 ^ 0x8000000000000000;
        dVar7 = 0.0;
        bVar4 = false;
        plVar1 = local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          plVar5 = plVar1 + 1;
          local_70 = *plVar1;
          local_98._8_2_ = *(undefined2 *)((game->board)._M_elems[2]._M_elems + 2);
          local_98.board._M_elems._0_8_ = *(undefined8 *)(game->board)._M_elems;
          local_a0 = dVar7;
          ttt::Board::ApplyMove(&local_98,&local_70);
          dVar6 = ABeta_<ttt::Board,minimax::Eval<ttt::Board>>
                            (&local_98,depth + -1,local_58,-local_88);
          dVar6 = -dVar6;
          dVar7 = dVar6;
          if ((bVar4) && (dVar6 <= local_a0)) {
            dVar7 = local_a0;
          }
          if (dVar6 <= local_88) {
            dVar6 = local_88;
          }
        } while ((dVar6 < local_68) &&
                (bVar4 = true, plVar1 = plVar5, local_88 = dVar6,
                uStack_80 = extraout_XMM0_Qb ^ 0x8000000000000000,
                plVar5 != local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_finish));
      }
      local_a0 = dVar7;
      if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      local_a0 = 0.0;
      if (iVar3 != 0) {
        IVar2 = ttt::Board::GetPlayerToMove(game);
        if (iVar3 == IVar2) {
          local_a0 = 1.79769313486232e+308;
        }
        else {
          local_a0 = -1.79769313486232e+308;
        }
      }
    }
  }
  return local_a0;
}

Assistant:

static double
ABeta_(const IGame &game, int depth, double alfa, double beta)
{
    Eval evaluator;

    if (depth == 0)
        return evaluator(game);

    auto status = game.GetStatus();
    if (status != game::Undecided)
    {
        if (status == game::Draw)
            return 0.0;
        if (status == game.GetPlayerToMove())
            return std::numeric_limits<double>::max();
        return -std::numeric_limits<double>::max();
    }

    bool result_set = false;
    double result = 0.0;
    auto moves = game.GetPossibleMoves();
    for (auto m : moves)
    {
        IGame new_game(game);
        new_game.ApplyMove(m);
        auto r = -ABeta_<IGame, Eval>(new_game, depth - 1, -beta, -alfa);
        if (!result_set || r > result)
            result = r, result_set = true;
        alfa = std::max(alfa, r);
        if (alfa >= beta)
            break;
    }

    return result;
}